

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::parseFromFile
          (Configurations *this,string *configurationFile,Configurations *base)

{
  char *path;
  ostream *poVar1;
  string local_1e8 [7];
  bool success;
  stringstream local_1b8 [8];
  stringstream internalInfoStream;
  ostream local_1a8 [383];
  byte local_29;
  Configurations *pCStack_28;
  bool assertionPassed;
  Configurations *base_local;
  string *configurationFile_local;
  Configurations *this_local;
  
  local_29 = 1;
  pCStack_28 = base;
  base_local = (Configurations *)configurationFile;
  configurationFile_local = (string *)this;
  path = (char *)std::__cxx11::string::c_str();
  local_29 = el::base::utils::File::pathExists(path,true);
  if (!(bool)local_29) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,"Configuration file [");
    poVar1 = std::operator<<(poVar1,(string *)base_local);
    std::operator<<(poVar1,"] does not exist!");
    poVar1 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd5);
    poVar1 = std::operator<<(poVar1,
                             ") [(assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true"
                            );
    poVar1 = std::operator<<(poVar1,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar1 = std::operator<<(poVar1,local_1e8);
    poVar1 = std::operator<<(poVar1,"\"");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  if ((local_29 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = Parser::parseFromFile((string *)base_local,this,pCStack_28);
    this->m_isFromFile = this_local._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool Configurations::parseFromFile(const std::string& configurationFile, Configurations* base) {
  // We initial assertion with true because if we have assertion diabled, we want to pass this
  // check and if assertion is enabled we will have values re-assigned any way.
  bool assertionPassed = true;
  ELPP_ASSERT((assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true,
              "Configuration file [" << configurationFile << "] does not exist!");
  if (!assertionPassed) {
    return false;
  }
  bool success = Parser::parseFromFile(configurationFile, this, base);
  m_isFromFile = success;
  return success;
}